

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

bool testing::internal::UnitTestOptions::MatchesFilter(string *name,char *filter)

{
  bool bVar1;
  char *pcVar2;
  char *in_RSI;
  char *cur_pattern;
  char *pattern;
  
  pattern = in_RSI;
  while( true ) {
    std::__cxx11::string::c_str();
    bVar1 = PatternMatchesString(pattern,in_RSI);
    if (bVar1) {
      return true;
    }
    pcVar2 = strchr(in_RSI,0x3a);
    if (pcVar2 == (char *)0x0) break;
    in_RSI = pcVar2 + 1;
  }
  return false;
}

Assistant:

bool UnitTestOptions::MatchesFilter(
    const std::string& name, const char* filter) {
  const char *cur_pattern = filter;
  for (;;) {
    if (PatternMatchesString(cur_pattern, name.c_str())) {
      return true;
    }

    // Finds the next pattern in the filter.
    cur_pattern = strchr(cur_pattern, ':');

    // Returns if no more pattern can be found.
    if (cur_pattern == NULL) {
      return false;
    }

    // Skips the pattern separater (the ':' character).
    cur_pattern++;
  }
}